

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldMapTests::TesthasGroup_groupDoesNotExist::RunImpl(TesthasGroup_groupDoesNotExist *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  bool local_10a;
  bool local_109;
  message_order local_108;
  FieldMap group;
  undefined1 local_e4 [8];
  undefined8 uStack_dc;
  undefined8 local_d4;
  FieldMap fieldMap;
  
  _group = normal;
  local_e4 = (undefined1  [8])0x0;
  uStack_dc = 0;
  local_d4 = 0;
  FIX::FieldMap::FieldMap(&fieldMap,(message_order *)&group);
  FIX::shared_array<int>::~shared_array((shared_array<int> *)(local_e4 + 4));
  local_108.m_mode = normal;
  local_108._4_8_ = 0;
  local_108.m_groupOrder._4_8_ = 0;
  local_108._20_8_ = 0;
  FIX::FieldMap::FieldMap(&group,&local_108);
  FIX::shared_array<int>::~shared_array(&local_108.m_groupOrder);
  FIX::FieldMap::addGroup((int)&fieldMap,(FieldMap *)0x1,SUB81(&group,0));
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_109 = false;
  local_10a = (bool)FIX::FieldMap::hasGroup((int)&fieldMap);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_108,*ppTVar2,0x66);
  UnitTest::CheckEqual<bool,bool>(results,&local_109,&local_10a,(TestDetails *)&local_108);
  FIX::FieldMap::~FieldMap(&group);
  FIX::FieldMap::~FieldMap(&fieldMap);
  return;
}

Assistant:

TEST(hasGroup_groupDoesNotExist)
{
  FieldMap fieldMap;
  FieldMap group;
  fieldMap.addGroup(1, group);

  CHECK_EQUAL(false, fieldMap.hasGroup(2));
}